

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O2

ostream * tcu::Format::operator<<(ostream *str,Array<const_unsigned_char_*> *fmt)

{
  uchar *puVar1;
  
  std::operator<<(str,"{ ");
  for (puVar1 = fmt->begin; puVar1 != fmt->end; puVar1 = puVar1 + 1) {
    if (puVar1 != fmt->begin) {
      std::operator<<(str,", ");
    }
    std::operator<<(str,*puVar1);
  }
  std::operator<<(str," }");
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Array<Iterator>& fmt)
{
	str << "{ ";
	for (Iterator cur = fmt.begin; cur != fmt.end; ++cur)
	{
		if (cur != fmt.begin)
			str << ", ";
		str << *cur;
	}
	str << " }";
	return str;
}